

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.h
# Opt level: O0

size_t __thiscall AggRegTuple_hash::operator()(AggRegTuple_hash *this,AggRegTuple *key)

{
  size_t sVar1;
  unsigned_long *in_RSI;
  size_t h;
  hash<unsigned_long> local_22;
  hash<unsigned_long> local_21;
  hash<unsigned_long> local_20;
  hash<unsigned_long> local_1f;
  hash<unsigned_long> local_1e;
  hash<bool> local_1d;
  hash<unsigned_long> local_1c;
  hash<bool> local_1b;
  hash<unsigned_long> local_1a;
  hash<unsigned_long> local_19;
  ulong local_18;
  unsigned_long *local_10;
  
  local_18 = 0;
  local_10 = in_RSI;
  sVar1 = std::hash<unsigned_long>::operator()(&local_19,*in_RSI);
  local_18 = sVar1 + 0x9e3779b9 + local_18 * 0x40 + (local_18 >> 2) ^ local_18;
  sVar1 = std::hash<unsigned_long>::operator()(&local_1a,local_10[1]);
  local_18 = sVar1 + 0x9e3779b9 + local_18 * 0x40 + (local_18 >> 2) ^ local_18;
  sVar1 = std::hash<bool>::operator()(&local_1b,(bool)((byte)local_10[2] & 1));
  local_18 = sVar1 + 0x9e3779b9 + local_18 * 0x40 + (local_18 >> 2) ^ local_18;
  sVar1 = std::hash<unsigned_long>::operator()(&local_1c,local_10[3]);
  local_18 = sVar1 + 0x9e3779b9 + local_18 * 0x40 + (local_18 >> 2) ^ local_18;
  sVar1 = std::hash<bool>::operator()(&local_1d,(bool)((byte)local_10[4] & 1));
  local_18 = sVar1 + 0x9e3779b9 + local_18 * 0x40 + (local_18 >> 2) ^ local_18;
  sVar1 = std::hash<unsigned_long>::operator()(&local_1e,local_10[5]);
  local_18 = sVar1 + 0x9e3779b9 + local_18 * 0x40 + (local_18 >> 2) ^ local_18;
  sVar1 = std::hash<unsigned_long>::operator()(&local_1f,local_10[0xb]);
  local_18 = sVar1 + 0x9e3779b9 + local_18 * 0x40 + (local_18 >> 2) ^ local_18;
  sVar1 = std::hash<unsigned_long>::operator()(&local_20,local_10[0xc]);
  local_18 = sVar1 + 0x9e3779b9 + local_18 * 0x40 + (local_18 >> 2) ^ local_18;
  sVar1 = std::hash<unsigned_long>::operator()(&local_21,local_10[6]);
  local_18 = sVar1 + 0x9e3779b9 + local_18 * 0x40 + (local_18 >> 2) ^ local_18;
  sVar1 = std::hash<unsigned_long>::operator()(&local_22,local_10[7]);
  return sVar1 + 0x9e3779b9 + local_18 * 0x40 + (local_18 >> 2) ^ local_18;
}

Assistant:

size_t operator()(const AggRegTuple &key ) const
    {
        size_t h = 0;
        h ^= std::hash<size_t>()(key.previous.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.previous.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<bool>()(key.product.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.product.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<bool>()(key.view.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.view.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.viewAgg.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.viewAgg.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        // h ^= std::hash<size_t>()(key.localAgg.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        // h ^= std::hash<size_t>()(key.localAgg.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.postLoop.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.postLoop.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        return h;
    }